

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_populated_single_string_key(planck_unit_test_t *tc)

{
  undefined4 local_8c;
  undefined4 local_88;
  char local_81 [8];
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  memset(local_81,0,9);
  bhdct_setup_string_key
            (tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)(key + 1),ion_fill_low
            );
  sprintf(local_81,"k%d",0x5c);
  local_88 = 0x5c;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_88,'\x01');
  local_8c = 0x5c;
  bhdct_get(tc,(ion_dictionary_t *)(key + 1),local_81,&local_8c,'\0',1);
  bhdct_takedown(tc,(ion_dictionary_t *)(key + 1));
  return;
}

Assistant:

void
test_bhdct_get_populated_single_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_low);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 92);
	bhdct_insert(tc, &dict, key, IONIZE(92, int), boolean_true);
	bhdct_get(tc, &dict, key, IONIZE(92, int), err_ok, 1);

	bhdct_takedown(tc, &dict);
}